

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O3

bool __thiscall ON_Extrusion::SetDomain(ON_Extrusion *this,int dir,double t0,double t1)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  
  bVar1 = ON_IsValid(t0);
  if ((bVar1) && (bVar1 = ON_IsValid(t1), t0 < t1 && bVar1)) {
    uVar2 = this->m_bTransposed ^ 1;
    if (uVar2 == dir) {
      ON_Interval::Set(&this->m_path_domain,t0,t1);
      return true;
    }
    if ((uVar2 ^ dir) == 1) {
      iVar3 = (*(this->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])();
      return SUB41(iVar3,0);
    }
  }
  return false;
}

Assistant:

bool ON_Extrusion::SetDomain( 
  int dir, // 0 sets first parameter's domain, 1 gets second parameter's domain
  double t0, 
  double t1
  )
{
  bool rc = false;
  if ( ON_IsValid(t0) && ON_IsValid(t1) && t0 < t1 )
  {
    const int path_dir = PathParameter();
    if ( path_dir == dir )
    {
      m_path_domain.Set(t0,t1);
      rc = true;
    }
    else if ( 1-path_dir == dir )
    {
      rc = m_profile->SetDomain(t0,t1)?true:false;
    }
  }
  return rc;
}